

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
helics::FederateInfo::loadInfoFromArgs_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FederateInfo *this,int argc,char **argv)

{
  ParseOutput PVar1;
  InvalidParameter *this_00;
  string_view message;
  undefined1 local_40 [12];
  int argc_local;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  makeCLIApp((FederateInfo *)local_40);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    ((helicsCLI11App *)local_40._0_8_,&argc_local,&argv_local);
  if (PVar1 != PARSE_ERROR) {
    config_additional(this,(App *)local_40._0_8_);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_40._0_8_ + 0x380));
    if ((helicsCLI11App *)local_40._0_8_ != (helicsCLI11App *)0x0) {
      (*((App *)local_40._0_8_)->_vptr_App[1])();
    }
    return __return_storage_ptr__;
  }
  this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
  message._M_str = "argument parsing failed";
  message._M_len = 0x17;
  InvalidParameter::InvalidParameter(this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::vector<std::string> FederateInfo::loadInfoFromArgs(int argc, char* argv[])
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(argc, argv);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
    return app->remainArgs();
}